

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrExp.c
# Opt level: O1

void Rwt_Man5ExplorePrint(void)

{
  stmm_table *psVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  stmm_generator *psVar5;
  void *__s;
  uint *__ptr;
  Vec_Int_t *pVVar6;
  int *piVar7;
  FILE *pFVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  uint *Sign;
  size_t sVar12;
  ulong uVar13;
  size_t sVar14;
  uint uTruth;
  int Counter;
  timespec ts;
  undefined1 local_48 [8];
  timespec local_40;
  
  clock_gettime(3,&local_40);
  psVar5 = stmm_init_gen(s_pManRwrExp5->tTableNN);
  iVar3 = stmm_gen(psVar5,(char **)local_48,(char **)(local_48 + 4));
  if (iVar3 == 0) {
    uVar4 = 0;
    uVar13 = 0;
  }
  else {
    uVar13 = 0;
    uVar4 = 0;
    do {
      uVar13 = (ulong)(uint)((int)uVar13 + local_48._4_4_);
      uVar2 = local_48._4_4_;
      if ((int)local_48._4_4_ < (int)uVar4) {
        uVar2 = uVar4;
      }
      uVar4 = uVar2;
      iVar3 = stmm_gen(psVar5,(char **)local_48,(char **)(local_48 + 4));
    } while (iVar3 != 0);
  }
  stmm_free_gen(psVar5);
  printf("Number of cuts considered       = %8d.\n",uVar13);
  printf("Classes occurring at least once = %8d.\n",
         (ulong)(uint)s_pManRwrExp5->tTableNN->num_entries);
  printf("The largest number of occurence = %8d.\n");
  sVar14 = (ulong)uVar4 * 4 + 4;
  __s = malloc(sVar14);
  __ptr = (uint *)malloc(sVar14);
  memset(__s,0,sVar14);
  psVar5 = stmm_init_gen(s_pManRwrExp5->tTableNN);
  iVar3 = stmm_gen(psVar5,(char **)local_48,(char **)(local_48 + 4));
  if (iVar3 != 0) {
    do {
      if ((int)uVar4 < (int)local_48._4_4_) {
        __assert_fail("Counter <= CountMax",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/rwr/rwrExp.c"
                      ,0xfb,"void Rwt_Man5ExplorePrint()");
      }
      piVar7 = (int *)((long)__s + (long)(int)local_48._4_4_ * 4);
      *piVar7 = *piVar7 + 1;
      __ptr[(int)local_48._4_4_] = local_48._0_4_;
      iVar3 = stmm_gen(psVar5,(char **)local_48,(char **)(local_48 + 4));
    } while (iVar3 != 0);
  }
  stmm_free_gen(psVar5);
  if (0 < (int)uVar4) {
    uVar13 = 1;
    Sign = __ptr;
    do {
      Sign = Sign + 1;
      if (*(int *)((long)__s + uVar13 * 4) != 0) {
        printf("Occurence = %6d.  Num classes = %4d.  Repr = ",uVar13 & 0xffffffff);
        Extra_PrintBinary(_stdout,Sign,0x20);
        putchar(10);
      }
      uVar13 = uVar13 + 1;
    } while (uVar4 + 1 != uVar13);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (__ptr != (uint *)0x0) {
    free(__ptr);
  }
  psVar1 = s_pManRwrExp5->tTableNN;
  iVar3 = psVar1->num_entries;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar9 = iVar3;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar9;
  if (iVar9 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar9 << 2);
  }
  pVVar6->pArray = piVar7;
  psVar5 = stmm_init_gen(psVar1);
  iVar3 = stmm_gen(psVar5,(char **)local_48,(char **)0x0);
  while (iVar3 != 0) {
    Vec_IntPush(pVVar6,local_48._0_4_);
    iVar3 = stmm_gen(psVar5,(char **)local_48,(char **)0x0);
  }
  stmm_free_gen(psVar5);
  piVar7 = pVVar6->pArray;
  uVar4 = pVVar6->nSize;
  sVar14 = (size_t)(int)uVar4;
  qsort(piVar7,sVar14,4,Vec_IntSortCompareUnsigned);
  pFVar8 = fopen("nnclass_stats5.txt","w");
  if (0 < (long)sVar14) {
    sVar12 = 0;
    do {
      local_48._0_4_ = piVar7[sVar12];
      iVar3 = stmm_lookup(s_pManRwrExp5->tTableNN,(char *)(ulong)(uint)local_48._0_4_,
                          (char **)(local_48 + 4));
      if (iVar3 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/rwr/rwrExp.c"
                      ,0x117,"void Rwt_Man5ExplorePrint()");
      }
      Extra_PrintHex((FILE *)pFVar8,(uint *)local_48,5);
      fprintf(pFVar8," %10d\n",(ulong)(uint)local_48._4_4_);
      sVar12 = sVar12 + 1;
    } while (sVar14 != sVar12);
  }
  fclose(pFVar8);
  printf("%d classes written into file \"%s\".\n",(ulong)uVar4,"nnclass_stats5.txt");
  iVar3 = clock_gettime(3,&local_40);
  if (iVar3 < 0) {
    lVar10 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  if (0 < (int)uVar4) {
    sVar12 = 0;
    do {
      local_48._0_4_ = piVar7[sVar12];
      uVar4 = Extra_TruthCanonNPN(local_48._0_4_,5);
      iVar3 = stmm_find_or_add(s_pManRwrExp5->tTableNPN,(char *)(ulong)uVar4,(char ***)&local_40);
      if (iVar3 == 0) {
        *(int *)local_40.tv_sec = 0;
      }
      iVar3 = stmm_lookup(s_pManRwrExp5->tTableNN,(char *)(ulong)(uint)local_48._0_4_,
                          (char **)(local_48 + 4));
      if (iVar3 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/rwr/rwrExp.c"
                      ,0x12a,"void Rwt_Man5ExplorePrint()");
      }
      *(int *)local_40.tv_sec = *(int *)local_40.tv_sec + local_48._4_4_;
      sVar12 = sVar12 + 1;
    } while (sVar14 != sVar12);
  }
  iVar3 = 0x8cd9f3;
  printf("The numbe of NPN classes = %d.\n",(ulong)(uint)s_pManRwrExp5->tTableNPN->num_entries);
  Abc_Print(iVar3,"%s =","Computing NPN classes");
  iVar9 = 3;
  iVar3 = clock_gettime(3,&local_40);
  if (iVar3 < 0) {
    lVar11 = -1;
  }
  else {
    lVar11 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(iVar9,"%9.2f sec\n",(double)(lVar11 + lVar10) / 1000000.0);
  psVar1 = s_pManRwrExp5->tTableNPN;
  iVar3 = psVar1->num_entries;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar9 = iVar3;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar9;
  if (iVar9 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar9 << 2);
  }
  pVVar6->pArray = piVar7;
  psVar5 = stmm_init_gen(psVar1);
  iVar3 = stmm_gen(psVar5,(char **)local_48,(char **)0x0);
  while (iVar3 != 0) {
    Vec_IntPush(pVVar6,local_48._0_4_);
    iVar3 = stmm_gen(psVar5,(char **)local_48,(char **)0x0);
  }
  stmm_free_gen(psVar5);
  piVar7 = pVVar6->pArray;
  uVar4 = pVVar6->nSize;
  sVar14 = (size_t)(int)uVar4;
  qsort(piVar7,sVar14,4,Vec_IntSortCompareUnsigned);
  pFVar8 = fopen("npnclass_stats5.txt","w");
  if (0 < (long)sVar14) {
    sVar12 = 0;
    do {
      local_48._0_4_ = piVar7[sVar12];
      iVar3 = stmm_lookup(s_pManRwrExp5->tTableNPN,(char *)(ulong)(uint)local_48._0_4_,
                          (char **)(local_48 + 4));
      if (iVar3 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/rwr/rwrExp.c"
                      ,0x13d,"void Rwt_Man5ExplorePrint()");
      }
      Extra_PrintHex((FILE *)pFVar8,(uint *)local_48,5);
      fprintf(pFVar8," %10d\n",(ulong)(uint)local_48._4_4_);
      sVar12 = sVar12 + 1;
    } while (sVar14 != sVar12);
  }
  fclose(pFVar8);
  printf("%d classes written into file \"%s\".\n",(ulong)uVar4,"npnclass_stats5.txt");
  return;
}

Assistant:

void Rwt_Man5ExplorePrint()
{
    FILE * pFile;
    stmm_generator * gen;
    int i, CountMax, nCuts, Counter;
    int * pDistrib;
    unsigned * pReprs;
    unsigned uTruth, uTruthC;
    abctime clk = Abc_Clock();
    Vec_Int_t * vClassesNN, * vClassesNPN;

    // find the max number of occurences
    nCuts = 0;
    CountMax = 0;
    stmm_foreach_item( s_pManRwrExp5->tTableNN, gen, (char **)&uTruth, (char **)&Counter )
    {
        nCuts += Counter;
        if ( CountMax < Counter )
            CountMax = Counter;
    }
    printf( "Number of cuts considered       = %8d.\n", nCuts );
    printf( "Classes occurring at least once = %8d.\n", stmm_count(s_pManRwrExp5->tTableNN) );
    printf( "The largest number of occurence = %8d.\n", CountMax );

    // print the distribution of classes
    pDistrib = ABC_ALLOC( int, CountMax + 1 );
    pReprs   = ABC_ALLOC( unsigned, CountMax + 1 );
    memset( pDistrib, 0, sizeof(int)*(CountMax + 1) );
    stmm_foreach_item( s_pManRwrExp5->tTableNN, gen, (char **)&uTruth, (char **)&Counter )
    {
        assert( Counter <= CountMax );
        pDistrib[ Counter ]++;
        pReprs[ Counter ] = uTruth;
    }

    for ( i = 1; i <= CountMax; i++ )
        if ( pDistrib[i] )
        {
            printf( "Occurence = %6d.  Num classes = %4d.  Repr = ", i, pDistrib[i] );
            Extra_PrintBinary( stdout, pReprs + i, 32 ); 
            printf( "\n" );
        }
    ABC_FREE( pDistrib );
    ABC_FREE( pReprs );


    // put them into an array
    vClassesNN = Vec_IntAlloc( stmm_count(s_pManRwrExp5->tTableNN) );
    stmm_foreach_item( s_pManRwrExp5->tTableNN, gen, (char **)&uTruth, NULL )
        Vec_IntPush( vClassesNN, (int)uTruth );
    Vec_IntSortUnsigned( vClassesNN );

    // write into a file all classes
    pFile = fopen( "nnclass_stats5.txt", "w" );
    Vec_IntForEachEntry( vClassesNN, uTruth, i )
    {
        if ( !stmm_lookup( s_pManRwrExp5->tTableNN, (char *)(ABC_PTRUINT_T)uTruth, (char **)&Counter ) )
        {
            assert( 0 );
        }
        Extra_PrintHex( pFile, &uTruth, 5 );
        fprintf( pFile, " %10d\n", Counter );
    }
    fclose( pFile );
    printf( "%d classes written into file \"%s\".\n", vClassesNN->nSize, "nnclass_stats5.txt" );


clk = Abc_Clock();
    // how many NPN classes exist?
    Vec_IntForEachEntry( vClassesNN, uTruth, i )
    {
        int * pCounter;
        uTruthC = Extra_TruthCanonNPN( uTruth, 5 );
        if ( !stmm_find_or_add( s_pManRwrExp5->tTableNPN, (char *)(ABC_PTRUINT_T)uTruthC, (char***)&pCounter ) )
            *pCounter = 0;
        if ( !stmm_lookup( s_pManRwrExp5->tTableNN, (char *)(ABC_PTRUINT_T)uTruth, (char **)&Counter ) )
        {
            assert( 0 );
        }
        (*pCounter) += Counter;
    }
    printf( "The numbe of NPN classes = %d.\n", stmm_count(s_pManRwrExp5->tTableNPN) );
ABC_PRT( "Computing NPN classes", Abc_Clock() - clk );

    // put them into an array
    vClassesNPN = Vec_IntAlloc( stmm_count(s_pManRwrExp5->tTableNPN) );
    stmm_foreach_item( s_pManRwrExp5->tTableNPN, gen, (char **)&uTruth, NULL )
        Vec_IntPush( vClassesNPN, (int)uTruth );
    Vec_IntSortUnsigned( vClassesNPN );

    // write into a file all classes
    pFile = fopen( "npnclass_stats5.txt", "w" );
    Vec_IntForEachEntry( vClassesNPN, uTruth, i )
    {
        if ( !stmm_lookup( s_pManRwrExp5->tTableNPN, (char *)(ABC_PTRUINT_T)uTruth, (char **)&Counter ) )
        {
            assert( 0 );
        }
        Extra_PrintHex( pFile, &uTruth, 5 );
        fprintf( pFile, " %10d\n", Counter );
    }
    fclose( pFile );
    printf( "%d classes written into file \"%s\".\n", vClassesNPN->nSize, "npnclass_stats5.txt" );


    // can they be uniquely characterized?

}